

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall
rw::ColorQuant::matchImage(ColorQuant *this,uint8 *dstPixels,uint32 dstStride,Image *img)

{
  uint8 uVar1;
  byte *in;
  long lVar2;
  uint8 *p;
  byte *in_00;
  uint8 rgba [4];
  RGBA local_4c;
  ulong local_48;
  ulong local_40;
  byte *local_38;
  
  in_00 = img->pixels;
  local_48 = (ulong)dstStride;
  local_40 = 0;
  do {
    if (img->height <= (int)local_40) {
      return;
    }
    local_38 = in_00;
    for (lVar2 = 0; (int)lVar2 < img->width; lVar2 = lVar2 + 1) {
      switch(img->depth << 0x1e | img->depth - 4U >> 2) {
      case 0:
      case 1:
        in = img->palette + (ulong)*in_00 * 4;
        goto LAB_0010ace4;
      case 3:
        conv_RGBA8888_from_ARGB1555(&local_4c.red,in_00);
        break;
      case 5:
        conv_RGBA8888_from_RGB888(&local_4c.red,in_00);
        break;
      case 7:
        in = in_00;
LAB_0010ace4:
        conv_RGBA8888_from_RGBA8888(&local_4c.red,in);
      }
      uVar1 = findColor(this,local_4c);
      dstPixels[lVar2] = uVar1;
      in_00 = in_00 + img->bpp;
    }
    in_00 = local_38 + img->stride;
    dstPixels = dstPixels + local_48;
    local_40 = (ulong)((int)local_40 + 1);
  } while( true );
}

Assistant:

void
ColorQuant::matchImage(uint8 *dstPixels, uint32 dstStride, Image *img)
{
	RGBA col;
	uint8 rgba[4];
	uint8 *pixels = img->pixels;
	for(int y = 0; y < img->height; y++){
		uint8 *line = pixels;
		uint8 *dline = dstPixels;
		for(int x = 0; x < img->width; x++){
			uint8 *p = line;
			uint8 *d = dline;
			switch(img->depth){
			case 4: case 8:
				conv_RGBA8888_from_RGBA8888(rgba, &img->palette[p[0]*4]);
				break;
			case 32:
				conv_RGBA8888_from_RGBA8888(rgba, p);
				break;
			case 24:
				conv_RGBA8888_from_RGB888(rgba, p);
				break;
			case 16:
				conv_RGBA8888_from_ARGB1555(rgba, p);
				break;
			default: assert(0 && "invalid depth");
			}
			
			col.red = rgba[0];
			col.green = rgba[1];
			col.blue = rgba[2];
			col.alpha = rgba[3];
			*d = this->findColor(col);

			line += img->bpp;
			dline++;
		}
		pixels += img->stride;
		dstPixels += dstStride;
	}
}